

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cc
# Opt level: O2

void __thiscall FileTest_File_Exist_Test::~FileTest_File_Exist_Test(FileTest_File_Exist_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FileTest, File_Exist) {
#ifndef _MSC_VER
  std::string filename = "/tmp/test";
#else
  std::string filename = "../../test";
#endif
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
  bool bo = FileExist(filename.c_str());
  EXPECT_EQ(bo, true);
  bo = FileExist("/tmp/non-exist-file");
  EXPECT_EQ(bo, false);
  Close(file);
  RemoveFile(filename.c_str());
}